

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepInterface.h
# Opt level: O0

void __thiscall
gurkenlaeufer::detail::
CommonStep<gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>_>::CommonStep
          (CommonStep<gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>_> *this,
          string *RegEx,BaseHook<(gurkenlaeufer::detail::Hooktype)0> *Step)

{
  list<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>*>,std::allocator<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>*>>>
  *this_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>_*>
  local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  BaseHook<(gurkenlaeufer::detail::Hooktype)0> *local_20;
  BaseHook<(gurkenlaeufer::detail::Hooktype)0> *Step_local;
  string *RegEx_local;
  CommonStep<gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>_> *this_local;
  
  this->_vptr_CommonStep = (_func_int **)&PTR__CommonStep_002a4b70;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20 = Step;
  Step_local = (BaseHook<(gurkenlaeufer::detail::Hooktype)0> *)RegEx;
  RegEx_local = (string *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_38);
  StepContext::StepContext(&this->_stepContext,&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  this_00 = (list<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>*>,std::allocator<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>*>>>
             *)CommonStep<gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>>::
               getStepRegistry_abi_cxx11_();
  std::
  make_pair<std::__cxx11::string&,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>*&>
            (&local_70,RegEx,&local_20);
  std::__cxx11::
  list<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>*>,std::allocator<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>*>>>
  ::
  emplace_back<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>*>>
            (this_00,&local_70);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>_*>
  ::~pair(&local_70);
  return;
}

Assistant:

CommonStep(std::string RegEx, TStep* Step)
            : _stepContext({})
        {
            getStepRegistry().emplace_back(std::make_pair(RegEx, Step));
        }